

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall embree::XMLWriter::store(XMLWriter *this,TriangleLight *light,ssize_t id)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int in_EDX;
  long in_RSI;
  XMLWriter *in_RDI;
  Vec3fa p;
  Vec3fa dz;
  Vec3fa dy;
  Vec3fa dx;
  vfloat4 b1;
  vfloat4 a1;
  vfloat4 b0;
  vfloat4 a0;
  allocator *name;
  XMLWriter *in_stack_fffffffffffffa00;
  string local_5f8 [32];
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [8];
  undefined8 uStack_5b0;
  undefined1 local_5a8 [16];
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  allocator local_541;
  string local_540 [32];
  int local_520;
  long local_518;
  undefined8 *local_508;
  undefined8 *local_500;
  undefined8 *local_4f8;
  undefined8 *local_4f0;
  undefined8 *local_4e8;
  undefined8 *local_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined8 local_488;
  undefined8 uStack_480;
  undefined1 local_478 [16];
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 *local_448;
  undefined8 *local_440;
  undefined8 *local_438;
  undefined8 *local_430;
  undefined8 *local_428;
  undefined8 *local_420;
  undefined8 *local_418;
  undefined8 *local_410;
  undefined8 *local_408;
  undefined8 *local_400;
  undefined8 *local_3f8;
  undefined1 *local_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 *local_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined8 *local_370;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined8 *local_350;
  undefined1 *local_330;
  undefined1 *local_310;
  undefined1 *local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 *local_2d0;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 *local_2a0;
  undefined1 *local_298;
  undefined8 *local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 *local_270;
  undefined1 *local_268;
  undefined8 *local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 *local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 *local_220;
  undefined8 *local_218;
  undefined8 *local_210;
  undefined8 *local_208;
  undefined8 *local_200;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined8 *local_1d8;
  undefined1 *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 *local_138;
  undefined8 *local_130;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  undefined8 *local_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  float fStack_94;
  float fStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined1 *local_18;
  undefined8 *local_10;
  undefined1 *local_8;
  
  name = &local_541;
  local_518 = in_RSI;
  local_520 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"TriangleLight",name);
  open(in_RDI,(char *)local_540,local_520);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  local_4e8 = (undefined8 *)(local_518 + 0x10);
  local_4f0 = (undefined8 *)(local_518 + 0x30);
  local_4e0 = &local_568;
  uVar1 = *local_4e8;
  uVar2 = *(undefined8 *)(local_518 + 0x18);
  uVar3 = *local_4f0;
  uVar4 = *(undefined8 *)(local_518 + 0x38);
  local_3d8._0_4_ = (float)uVar1;
  local_3d8._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_3d0._0_4_ = (float)uVar2;
  uStack_3d0._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_3e8._0_4_ = (float)uVar3;
  local_3e8._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_3e0._0_4_ = (float)uVar4;
  uStack_3e0._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_388 = (float)local_3d8 - (float)local_3e8;
  fStack_384 = local_3d8._4_4_ - local_3e8._4_4_;
  fStack_380 = (float)uStack_3d0 - (float)uStack_3e0;
  fStack_37c = uStack_3d0._4_4_ - uStack_3e0._4_4_;
  local_2e8 = CONCAT44(fStack_384,local_388);
  uStack_2e0 = CONCAT44(fStack_37c,fStack_380);
  local_500 = (undefined8 *)(local_518 + 0x20);
  local_508 = (undefined8 *)(local_518 + 0x30);
  local_4f8 = &local_578;
  uVar5 = *local_500;
  uVar6 = *(undefined8 *)(local_518 + 0x28);
  uVar7 = *local_508;
  uVar8 = *(undefined8 *)(local_518 + 0x38);
  local_3b8._0_4_ = (float)uVar5;
  local_3b8._4_4_ = (float)((ulong)uVar5 >> 0x20);
  uStack_3b0._0_4_ = (float)uVar6;
  uStack_3b0._4_4_ = (float)((ulong)uVar6 >> 0x20);
  local_3c8._0_4_ = (float)uVar7;
  local_3c8._4_4_ = (float)((ulong)uVar7 >> 0x20);
  uStack_3c0._0_4_ = (float)uVar8;
  uStack_3c0._4_4_ = (float)((ulong)uVar8 >> 0x20);
  local_368 = (float)local_3b8 - (float)local_3c8;
  fStack_364 = local_3b8._4_4_ - local_3c8._4_4_;
  fStack_360 = (float)uStack_3b0 - (float)uStack_3c0;
  fStack_35c = uStack_3b0._4_4_ - uStack_3c0._4_4_;
  local_438 = &local_588;
  local_2d0 = &local_458;
  auVar10._8_8_ = uStack_570;
  auVar10._0_8_ = local_578;
  local_2f0 = local_478;
  local_260 = &local_468;
  fStack_1e0 = (float)local_578;
  fStack_1dc = (float)((ulong)uStack_570 >> 0x20);
  local_258 = auVar10._4_8_;
  local_198._8_4_ = fStack_1e0;
  local_198._0_8_ = local_258;
  local_198._12_4_ = fStack_1dc;
  uStack_250 = local_198._8_8_;
  uStack_460 = local_198._8_8_;
  auVar11._8_8_ = uStack_560;
  auVar11._0_8_ = local_568;
  local_310 = local_498;
  local_290 = &local_488;
  fStack_1ac = (float)((ulong)uStack_560 >> 0x20);
  local_288 = auVar11._4_8_;
  local_188._8_4_ = (float)local_568;
  local_188._0_8_ = local_288;
  local_188._12_4_ = fStack_1ac;
  uStack_280 = local_188._8_8_;
  uStack_480 = local_188._8_8_;
  local_330 = local_4a8;
  local_220 = &local_4d8;
  uStack_80 = local_188._8_8_;
  local_88._0_4_ = (float)((ulong)local_568 >> 0x20);
  local_88._4_4_ = (float)uStack_560;
  fStack_94 = (float)((ulong)local_578 >> 0x20);
  fStack_90 = (float)uStack_570;
  local_1b8 = (float)local_88 * fStack_1e0;
  fStack_1b4 = local_88._4_4_ * fStack_94;
  fStack_1b0 = (float)local_568 * fStack_90;
  fStack_1ac = fStack_1ac * fStack_1dc;
  local_2c8 = &local_4c8;
  local_1f0 = &local_238;
  uStack_70 = local_198._8_8_;
  local_1e8 = local_388 * fStack_94;
  fStack_1e4 = fStack_384 * fStack_90;
  fStack_1e0 = fStack_380 * fStack_1e0;
  fStack_1dc = fStack_37c * fStack_1dc;
  local_d8 = CONCAT44(fStack_1e4,local_1e8);
  uStack_d0 = CONCAT44(fStack_1dc,fStack_1e0);
  local_e8 = (float)local_4d8;
  fStack_e4 = (float)((ulong)local_4d8 >> 0x20);
  fStack_e0 = (float)uStack_4d0;
  fStack_dc = (float)((ulong)uStack_4d0 >> 0x20);
  local_c8 = local_1e8 - local_e8;
  fStack_c4 = fStack_1e4 - fStack_e4;
  fStack_c0 = fStack_1e0 - fStack_e0;
  fStack_bc = fStack_1dc - fStack_dc;
  local_148 = CONCAT44(fStack_c4,local_c8);
  uStack_140 = CONCAT44(fStack_bc,fStack_c0);
  local_2c0 = &local_4b8;
  auVar9._8_8_ = uStack_140;
  auVar9._0_8_ = local_148;
  local_3a8 = auVar9._4_8_;
  local_178._8_4_ = local_c8;
  local_178._0_8_ = local_3a8;
  local_178._12_4_ = fStack_bc;
  uStack_2b0 = local_178._8_8_;
  uStack_4b0 = local_178._8_8_;
  uStack_3a0 = local_178._8_8_;
  uStack_580 = local_178._8_8_;
  local_430 = (undefined8 *)(local_518 + 0x30);
  local_428 = &local_598;
  local_598 = *local_430;
  uStack_590 = *(undefined8 *)(local_518 + 0x38);
  local_400 = &local_5d8;
  local_18 = local_5c8;
  local_8 = local_5b8;
  uStack_5b0 = local_178._8_8_;
  local_3f0 = local_5a8;
  local_448 = local_4f8;
  local_440 = local_4e0;
  local_420 = local_428;
  local_418 = local_438;
  local_410 = local_4f8;
  local_408 = local_4e0;
  local_3f8 = local_428;
  local_3e8 = uVar3;
  uStack_3e0 = uVar4;
  local_3d8 = uVar1;
  uStack_3d0 = uVar2;
  local_3c8 = uVar7;
  uStack_3c0 = uVar8;
  local_3b8 = uVar5;
  uStack_3b0 = uVar6;
  local_390 = local_438;
  local_370 = local_4e0;
  local_350 = local_4f8;
  local_2b8 = local_3a8;
  local_2a0 = local_2c0;
  local_298 = local_310;
  local_270 = local_290;
  local_268 = local_2f0;
  local_240 = local_260;
  local_218 = local_260;
  local_210 = local_2d0;
  local_208 = local_2c8;
  local_200 = local_260;
  local_1f8 = local_2d0;
  local_1d8 = local_1f0;
  local_1d0 = local_330;
  local_1c8 = local_290;
  local_1c0 = local_220;
  local_1a8 = local_220;
  local_1a0 = local_2c0;
  local_138 = local_330;
  local_130 = local_290;
  local_128 = local_260;
  local_120 = local_2d0;
  local_118 = local_2f0;
  local_110 = local_310;
  local_108 = local_2c8;
  local_100 = local_220;
  local_f8 = local_1f0;
  local_f0 = local_2c8;
  local_b0 = local_2c8;
  local_a8 = local_220;
  local_a0 = local_1f0;
  local_88 = local_288;
  local_78 = local_258;
  local_68 = local_2e8;
  uStack_60 = uStack_2e0;
  local_50 = local_438;
  local_48 = local_4f8;
  local_40 = local_4e0;
  local_38 = local_400;
  local_30 = local_4e0;
  local_28 = local_400;
  local_20 = local_4f8;
  local_10 = local_438;
  local_5d8 = local_2e8;
  uStack_5d0 = uStack_2e0;
  local_588 = local_3a8;
  local_578 = CONCAT44(fStack_364,local_368);
  uStack_570 = CONCAT44(fStack_35c,fStack_360);
  local_568 = local_2e8;
  uStack_560 = uStack_2e0;
  local_4d8 = CONCAT44(fStack_1b4,local_1b8);
  uStack_4d0 = CONCAT44(fStack_1ac,fStack_1b0);
  local_4c8 = local_148;
  uStack_4c0 = uStack_140;
  local_4b8 = local_3a8;
  local_488 = local_288;
  local_468 = local_258;
  local_458 = local_2e8;
  uStack_450 = uStack_2e0;
  local_238 = local_d8;
  uStack_230 = uStack_d0;
  store(in_stack_fffffffffffffa00,(char *)name,(AffineSpace3fa *)in_RDI);
  store(in_stack_fffffffffffffa00,(char *)name,(Vec3fa *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5f8,"TriangleLight",(allocator *)&stack0xfffffffffffffa07);
  close(in_RDI,(int)local_5f8);
  std::__cxx11::string::~string(local_5f8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffa07);
  return;
}

Assistant:

void XMLWriter::store(const SceneGraph::TriangleLight& light, ssize_t id)
  {
    open("TriangleLight",id);
    const Vec3fa dx = light.v0-light.v2;
    const Vec3fa dy = light.v1-light.v2;
    const Vec3fa dz = cross(dx,dy);
    const Vec3fa p = light.v2;
    store("AffineSpace",AffineSpace3fa(dx,dy,dz,p));
    store("L",light.L);
    close("TriangleLight");
  }